

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_3_1_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  float *data;
  ulong uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  int k_count;
  float *pfVar35;
  long lVar36;
  float *pfVar37;
  float *pfVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  int k;
  int iVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  int data_width;
  
  auVar57._8_4_ = 0x80000000;
  auVar57._0_8_ = 0x8000000080000000;
  auVar57._12_4_ = 0x80000000;
  auVar58._8_4_ = 0x3effffff;
  auVar58._0_8_ = 0x3effffff3effffff;
  auVar58._12_4_ = 0x3effffff;
  fVar64 = ipoint->scale;
  auVar81 = ZEXT464((uint)fVar64);
  auVar50 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)fVar64),auVar57,0xf8);
  auVar50 = ZEXT416((uint)(fVar64 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  iVar18 = (int)auVar50._0_4_;
  fVar63 = -0.08 / (fVar64 * fVar64);
  auVar51 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)ipoint->x),auVar57,0xf8);
  auVar51 = ZEXT416((uint)(ipoint->x + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52._0_8_ = (double)auVar51._0_4_;
  auVar52._8_8_ = auVar51._8_8_;
  auVar56._0_8_ = (double)fVar64;
  auVar56._8_8_ = 0;
  auVar51 = vfmadd231sd_fma(auVar52,auVar56,ZEXT816(0x3fe0000000000000));
  auVar55._0_4_ = (float)auVar51._0_8_;
  auVar55._4_12_ = auVar51._4_12_;
  auVar51 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)ipoint->y),auVar57,0xf8);
  auVar51 = ZEXT416((uint)(ipoint->y + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar53._0_8_ = (double)auVar51._0_4_;
  auVar53._8_8_ = auVar51._8_8_;
  auVar51 = vfmadd231sd_fma(auVar53,auVar56,ZEXT816(0x3fe0000000000000));
  auVar54._0_4_ = (float)auVar51._0_8_;
  auVar54._4_12_ = auVar51._4_12_;
  auVar51._0_4_ = (int)auVar50._0_4_;
  auVar51._4_4_ = (int)auVar50._4_4_;
  auVar51._8_4_ = (int)auVar50._8_4_;
  auVar51._12_4_ = (int)auVar50._12_4_;
  auVar50 = vcvtdq2ps_avx(auVar51);
  fVar3 = auVar55._0_4_ - auVar50._0_4_;
  fVar4 = auVar54._0_4_ - auVar50._0_4_;
  auVar50 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar64),auVar55);
  auVar51 = vpternlogd_avx512vl(auVar58,auVar50,auVar57,0xf8);
  auVar50 = ZEXT416((uint)(auVar50._0_4_ + auVar51._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = ZEXT416((uint)fVar64);
  if (iVar18 < (int)auVar50._0_4_) {
    auVar50 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar51,auVar54);
    auVar59._8_4_ = 0x3effffff;
    auVar59._0_8_ = 0x3effffff3effffff;
    auVar59._12_4_ = 0x3effffff;
    auVar60._8_4_ = 0x80000000;
    auVar60._0_8_ = 0x8000000080000000;
    auVar60._12_4_ = 0x80000000;
    auVar52 = vpternlogd_avx512vl(auVar60,auVar50,auVar59,0xea);
    auVar50 = ZEXT416((uint)(auVar50._0_4_ + auVar52._0_4_));
    auVar50 = vroundss_avx(auVar50,auVar50,0xb);
    if (iVar18 < (int)auVar50._0_4_) {
      auVar50 = vfmadd231ss_fma(auVar55,auVar51,ZEXT416(0x41300000));
      auVar61._8_4_ = 0x80000000;
      auVar61._0_8_ = 0x8000000080000000;
      auVar61._12_4_ = 0x80000000;
      auVar52 = vpternlogd_avx512vl(auVar61,auVar50,auVar59,0xea);
      auVar50 = ZEXT416((uint)(auVar50._0_4_ + auVar52._0_4_));
      auVar50 = vroundss_avx(auVar50,auVar50,0xb);
      if ((int)auVar50._0_4_ + iVar18 <= iimage->width) {
        auVar50 = vfmadd231ss_fma(auVar54,auVar51,ZEXT416(0x41300000));
        auVar16._8_4_ = 0x80000000;
        auVar16._0_8_ = 0x8000000080000000;
        auVar16._12_4_ = 0x80000000;
        auVar52 = vpternlogd_avx512vl(auVar59,auVar50,auVar16,0xf8);
        auVar50 = ZEXT416((uint)(auVar50._0_4_ + auVar52._0_4_));
        auVar50 = vroundss_avx(auVar50,auVar50,0xb);
        if ((int)auVar50._0_4_ + iVar18 <= iimage->height) {
          fVar4 = fVar4 + 0.5;
          pfVar35 = iimage->data;
          iVar1 = iimage->data_width;
          iVar28 = iVar18 * 2;
          pfVar38 = haarResponseY;
          pfVar37 = haarResponseX;
          iVar22 = -0xc;
          do {
            auVar50._0_4_ = (float)iVar22;
            auVar78 = in_ZMM8._4_12_;
            auVar50._4_12_ = auVar78;
            auVar50 = vfmadd213ss_fma(auVar50,auVar51,ZEXT416((uint)fVar4));
            iVar29 = (int)auVar50._0_4_;
            auVar73._0_4_ = (float)(iVar22 + 1);
            auVar73._4_12_ = auVar78;
            auVar50 = vfmadd213ss_fma(auVar73,auVar51,ZEXT416((uint)fVar4));
            iVar49 = (int)auVar50._0_4_;
            auVar74._0_4_ = (float)(iVar22 + 2);
            auVar74._4_12_ = auVar78;
            auVar50 = vfmadd213ss_fma(auVar74,auVar51,ZEXT416((uint)fVar4));
            iVar32 = (int)auVar50._0_4_;
            iVar31 = (iVar29 + -1) * iVar1;
            iVar46 = (iVar29 + -1 + iVar18) * iVar1;
            iVar30 = (iVar29 + -1 + iVar28) * iVar1;
            iVar43 = (iVar49 + -1) * iVar1;
            iVar25 = (iVar49 + -1 + iVar18) * iVar1;
            iVar23 = (iVar49 + -1 + iVar28) * iVar1;
            iVar41 = (iVar32 + -1) * iVar1;
            iVar49 = (iVar32 + -1 + iVar18) * iVar1;
            iVar29 = (iVar32 + -1 + iVar28) * iVar1;
            lVar48 = 0;
            do {
              auVar75._0_4_ = (float)((int)lVar48 + -0xc);
              auVar75._4_12_ = auVar58._4_12_;
              auVar50 = vfmadd213ss_fma(auVar75,auVar51,ZEXT416((uint)(fVar3 + 0.5)));
              iVar42 = (int)auVar50._0_4_;
              iVar32 = iVar42 + -1 + iVar18;
              iVar34 = iVar42 + -1 + iVar28;
              fVar64 = pfVar35[iVar46 + -1 + iVar42];
              fVar5 = pfVar35[iVar30 + -1 + iVar42];
              fVar6 = pfVar35[iVar30 + iVar34];
              fVar7 = pfVar35[iVar31 + -1 + iVar42];
              fVar8 = pfVar35[iVar31 + iVar34];
              auVar52 = SUB6416(ZEXT464(0x40000000),0);
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar31 + iVar32] -
                                                      pfVar35[iVar30 + iVar32])),auVar52,
                                        ZEXT416((uint)(fVar6 - fVar7)));
              fVar69 = pfVar35[iVar46 + iVar34];
              pfVar37[lVar48] = (fVar5 - fVar8) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar69)),auVar52,
                                        ZEXT416((uint)(fVar6 - fVar7)));
              pfVar38[lVar48] = auVar50._0_4_ - (fVar5 - fVar8);
              fVar64 = pfVar35[iVar25 + -1 + iVar42];
              fVar5 = pfVar35[iVar23 + -1 + iVar42];
              fVar6 = pfVar35[iVar23 + iVar34];
              fVar7 = pfVar35[iVar43 + -1 + iVar42];
              fVar8 = pfVar35[iVar43 + iVar34];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar43 + iVar32] -
                                                      pfVar35[iVar23 + iVar32])),auVar52,
                                        ZEXT416((uint)(fVar6 - fVar7)));
              fVar69 = pfVar35[iVar25 + iVar34];
              pfVar37[lVar48 + 0x18] = (fVar5 - fVar8) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar69)),auVar52,
                                        ZEXT416((uint)(fVar6 - fVar7)));
              pfVar38[lVar48 + 0x18] = auVar50._0_4_ - (fVar5 - fVar8);
              fVar64 = pfVar35[iVar49 + -1 + iVar42];
              fVar5 = pfVar35[iVar29 + -1 + iVar42];
              fVar6 = pfVar35[iVar34 + iVar29];
              fVar7 = pfVar35[iVar41 + -1 + iVar42];
              fVar8 = pfVar35[iVar41 + iVar34];
              fVar69 = pfVar35[iVar49 + iVar34];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar41 + iVar32] -
                                                      pfVar35[iVar32 + iVar29])),auVar52,
                                        ZEXT416((uint)(fVar6 - fVar7)));
              pfVar37[lVar48 + 0x30] = (fVar5 - fVar8) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar69)),auVar52,
                                        ZEXT416((uint)(fVar6 - fVar7)));
              pfVar38[lVar48 + 0x30] = auVar50._0_4_ - (fVar5 - fVar8);
              lVar48 = lVar48 + 1;
            } while (lVar48 != 0x18);
            pfVar38 = pfVar38 + 0x48;
            pfVar37 = pfVar37 + 0x48;
            bVar2 = iVar22 < 9;
            iVar22 = iVar22 + 3;
          } while (bVar2);
          goto LAB_001e08bd;
        }
      }
    }
  }
  iVar1 = iVar18 * 2;
  lVar48 = 0;
  iVar28 = -0xc;
  do {
    auVar65._0_4_ = (float)iVar28;
    auVar78 = in_ZMM8._4_12_;
    auVar65._4_12_ = auVar78;
    auVar53 = auVar81._0_16_;
    auVar50 = vfmadd213ss_fma(auVar65,auVar53,ZEXT416((uint)fVar4));
    auVar67._0_4_ = (float)(iVar28 + 1);
    auVar67._4_12_ = auVar78;
    auVar52 = vfmadd213ss_fma(auVar67,auVar53,ZEXT416((uint)fVar4));
    auVar70._0_4_ = (float)(iVar28 + 2);
    auVar70._4_12_ = auVar78;
    auVar53 = vfmadd213ss_fma(auVar70,auVar53,ZEXT416((uint)fVar4));
    fVar64 = auVar50._0_4_;
    iVar22 = (int)((double)((ulong)(0.0 <= fVar64) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar64) * -0x4020000000000000) + (double)fVar64);
    fVar64 = auVar52._0_4_;
    iVar29 = (int)((double)((ulong)(0.0 <= fVar64) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar64) * -0x4020000000000000) + (double)fVar64);
    fVar64 = auVar53._0_4_;
    iVar31 = (int)((double)((ulong)(0.0 <= fVar64) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar64) * -0x4020000000000000) + (double)fVar64);
    lVar44 = 0;
    iVar46 = -0xc;
    do {
      auVar66._0_4_ = (float)iVar46;
      auVar66._4_12_ = in_ZMM8._4_12_;
      auVar50 = vfmadd213ss_fma(auVar66,auVar81._0_16_,ZEXT416((uint)fVar3));
      fVar64 = auVar50._0_4_;
      pfVar35 = (float *)((long)haarResponseX + lVar44 + lVar48);
      pfVar38 = (float *)((long)haarResponseY + lVar44 + lVar48);
      iVar25 = (int)((double)((ulong)(0.0 <= fVar64) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar64) * -0x4020000000000000) + (double)fVar64);
      if ((((iVar22 < 1) || (iVar25 < 1)) || (iimage->height < iVar1 + iVar22)) ||
         (iVar49 = iVar1 + iVar25, iimage->width < iVar49)) {
        haarXY(iimage,iVar22,iVar25,iVar18,pfVar35,pfVar38);
      }
      else {
        iVar32 = iVar25 + -1 + iVar18;
        pfVar37 = iimage->data;
        iVar30 = iimage->data_width;
        iVar23 = iVar30 * (iVar22 + -1);
        iVar41 = iVar30 * (iVar22 + -1 + iVar18);
        fVar64 = pfVar37[iVar41 + -1 + iVar25];
        iVar30 = iVar30 * (iVar1 + -1 + iVar22);
        fVar5 = pfVar37[iVar30 + -1 + iVar25];
        fVar6 = pfVar37[iVar30 + -1 + iVar49];
        fVar7 = pfVar37[iVar23 + -1 + iVar25];
        fVar8 = pfVar37[iVar23 + -1 + iVar49];
        fVar69 = pfVar37[iVar41 + -1 + iVar49];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar23 + iVar32] - pfVar37[iVar30 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar35 = (fVar5 - fVar8) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar69)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar38 = auVar50._0_4_ - (fVar5 - fVar8);
      }
      pfVar35 = (float *)((long)haarResponseX + lVar44 + 0x60 + lVar48);
      pfVar38 = (float *)((long)haarResponseY + lVar44 + 0x60 + lVar48);
      if (((iVar29 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar1 + iVar29 || (iVar49 = iVar1 + iVar25, iimage->width < iVar49)))) {
        haarXY(iimage,iVar29,iVar25,iVar18,pfVar35,pfVar38);
      }
      else {
        iVar32 = iVar25 + -1 + iVar18;
        pfVar37 = iimage->data;
        iVar30 = iimage->data_width;
        iVar23 = iVar30 * (iVar29 + -1);
        iVar41 = iVar30 * (iVar29 + -1 + iVar18);
        fVar64 = pfVar37[iVar41 + -1 + iVar25];
        iVar30 = iVar30 * (iVar1 + -1 + iVar29);
        fVar5 = pfVar37[iVar30 + -1 + iVar25];
        fVar6 = pfVar37[iVar30 + -1 + iVar49];
        fVar7 = pfVar37[iVar23 + -1 + iVar25];
        fVar8 = pfVar37[iVar23 + -1 + iVar49];
        fVar69 = pfVar37[iVar41 + -1 + iVar49];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar23 + iVar32] - pfVar37[iVar30 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar35 = (fVar5 - fVar8) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar69)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar38 = auVar50._0_4_ - (fVar5 - fVar8);
      }
      pfVar35 = (float *)((long)haarResponseX + lVar44 + 0xc0 + lVar48);
      pfVar38 = (float *)((long)haarResponseY + lVar44 + 0xc0 + lVar48);
      if (((iVar31 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar1 + iVar31 || (iVar49 = iVar1 + iVar25, iimage->width < iVar49)))) {
        haarXY(iimage,iVar31,iVar25,iVar18,pfVar35,pfVar38);
      }
      else {
        iVar23 = iVar25 + -1 + iVar18;
        pfVar37 = iimage->data;
        iVar30 = iimage->data_width;
        iVar32 = iVar30 * (iVar31 + -1);
        iVar41 = iVar30 * (iVar31 + -1 + iVar18);
        fVar64 = pfVar37[iVar41 + -1 + iVar25];
        iVar30 = iVar30 * (iVar1 + -1 + iVar31);
        fVar5 = pfVar37[iVar30 + -1 + iVar25];
        fVar6 = pfVar37[iVar30 + -1 + iVar49];
        fVar7 = pfVar37[iVar32 + -1 + iVar25];
        fVar8 = pfVar37[iVar32 + -1 + iVar49];
        fVar69 = pfVar37[iVar41 + -1 + iVar49];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar32 + iVar23] - pfVar37[iVar30 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar35 = (fVar5 - fVar8) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar69)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar38 = auVar50._0_4_ - (fVar5 - fVar8);
      }
      auVar81 = ZEXT1664(auVar51);
      iVar46 = iVar46 + 1;
      lVar44 = lVar44 + 4;
    } while (lVar44 != 0x60);
    lVar48 = lVar48 + 0x120;
    bVar2 = iVar28 < 9;
    iVar28 = iVar28 + 3;
  } while (bVar2);
LAB_001e08bd:
  fVar64 = auVar81._0_4_;
  auVar80._8_4_ = 0x3effffff;
  auVar80._0_8_ = 0x3effffff3effffff;
  auVar80._12_4_ = 0x3effffff;
  auVar79._8_4_ = 0x80000000;
  auVar79._0_8_ = 0x8000000080000000;
  auVar79._12_4_ = 0x80000000;
  auVar50 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 0.5)),auVar79,0xf8);
  auVar50 = ZEXT416((uint)(fVar64 * 0.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 1.5)),auVar79,0xf8);
  auVar51 = ZEXT416((uint)(fVar64 * 1.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 2.5)),auVar79,0xf8);
  auVar52 = ZEXT416((uint)(fVar64 * 2.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 3.5)),auVar79,0xf8);
  auVar53 = ZEXT416((uint)(fVar64 * 3.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 4.5)),auVar79,0xf8);
  auVar54 = ZEXT416((uint)(fVar64 * 4.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 5.5)),auVar79,0xf8);
  auVar55 = ZEXT416((uint)(fVar64 * 5.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 6.5)),auVar79,0xf8);
  auVar56 = ZEXT416((uint)(fVar64 * 6.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 7.5)),auVar79,0xf8);
  auVar57 = ZEXT416((uint)(auVar57._0_4_ + fVar64 * 7.5));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 8.5)),auVar79,0xf8);
  auVar58 = ZEXT416((uint)(fVar64 * 8.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 9.5)),auVar79,0xf8);
  auVar59 = ZEXT416((uint)(fVar64 * 9.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 10.5)),auVar79,0xf8);
  auVar60 = ZEXT416((uint)(fVar64 * 10.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar64 * 11.5)),auVar79,0xf8);
  auVar61 = ZEXT416((uint)(fVar64 * 11.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  fVar69 = auVar52._0_4_;
  fVar64 = fVar69 + auVar51._0_4_;
  fVar4 = fVar69 + auVar50._0_4_;
  fVar3 = fVar69 - auVar50._0_4_;
  fVar5 = fVar69 - auVar51._0_4_;
  fVar6 = fVar69 - auVar53._0_4_;
  fVar7 = fVar69 - auVar54._0_4_;
  fVar8 = fVar69 - auVar55._0_4_;
  fVar69 = fVar69 - auVar56._0_4_;
  fVar77 = auVar57._0_4_;
  fVar9 = fVar77 - auVar53._0_4_;
  fVar10 = fVar77 - auVar54._0_4_;
  fVar11 = fVar77 - auVar55._0_4_;
  fVar12 = fVar77 - auVar56._0_4_;
  fVar13 = fVar77 - auVar58._0_4_;
  fVar14 = fVar77 - auVar59._0_4_;
  fVar15 = fVar77 - auVar60._0_4_;
  fVar77 = fVar77 - auVar61._0_4_;
  gauss_s1_c0[0] = expf(fVar64 * fVar64 * fVar63);
  gauss_s1_c0[1] = expf(fVar4 * fVar4 * fVar63);
  gauss_s1_c0[2] = expf(fVar3 * fVar3 * fVar63);
  gauss_s1_c0[3] = expf(fVar5 * fVar5 * fVar63);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar6 * fVar6 * fVar63);
  gauss_s1_c0[6] = expf(fVar7 * fVar7 * fVar63);
  gauss_s1_c0[7] = expf(fVar8 * fVar8 * fVar63);
  gauss_s1_c0[8] = expf(fVar69 * fVar69 * fVar63);
  gauss_s1_c1[0] = expf(fVar9 * fVar9 * fVar63);
  gauss_s1_c1[1] = expf(fVar10 * fVar10 * fVar63);
  gauss_s1_c1[2] = expf(fVar11 * fVar11 * fVar63);
  gauss_s1_c1[3] = expf(fVar12 * fVar12 * fVar63);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar13 * fVar13 * fVar63);
  gauss_s1_c1[6] = expf(fVar14 * fVar14 * fVar63);
  gauss_s1_c1[7] = expf(fVar15 * fVar15 * fVar63);
  gauss_s1_c1[8] = expf(fVar77 * fVar77 * fVar63);
  uVar20 = 0xfffffff8;
  lVar48 = 0;
  fVar64 = 0.0;
  auVar68._8_4_ = 0x7fffffff;
  auVar68._0_8_ = 0x7fffffff7fffffff;
  auVar68._12_4_ = 0x7fffffff;
  lVar44 = 0;
  lVar39 = 0;
  do {
    pfVar35 = gauss_s1_c1;
    uVar19 = (uint)uVar20;
    if (uVar19 != 7) {
      pfVar35 = gauss_s1_c0;
    }
    if (uVar19 == 0xfffffff8) {
      pfVar35 = gauss_s1_c1;
    }
    lVar44 = (long)(int)lVar44;
    iVar18 = (int)lVar39;
    lVar39 = (long)iVar18;
    lVar36 = (long)haarResponseX + lVar48;
    lVar26 = (long)haarResponseY + lVar48;
    uVar33 = 0xfffffff8;
    uVar27 = 0;
    do {
      pfVar38 = gauss_s1_c1;
      if (uVar33 != 7) {
        pfVar38 = gauss_s1_c0;
      }
      if (uVar33 == 0xfffffff8) {
        pfVar38 = gauss_s1_c1;
      }
      uVar21 = (ulong)(uVar33 >> 0x1c & 0xfffffff8);
      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar24 = uVar27;
      lVar45 = lVar36;
      lVar47 = lVar26;
      do {
        lVar40 = 0;
        pfVar37 = (float *)((long)pfVar35 + (ulong)(uint)((int)(uVar20 >> 0x1f) << 5));
        do {
          fVar4 = pfVar38[uVar21] * *pfVar37;
          auVar50 = vinsertps_avx(ZEXT416(*(uint *)(lVar47 + lVar40 * 4)),
                                  ZEXT416(*(uint *)(lVar45 + lVar40 * 4)),0x10);
          auVar76._0_4_ = fVar4 * auVar50._0_4_;
          auVar76._4_4_ = fVar4 * auVar50._4_4_;
          auVar76._8_4_ = fVar4 * auVar50._8_4_;
          auVar76._12_4_ = fVar4 * auVar50._12_4_;
          auVar50 = vandps_avx(auVar76,auVar68);
          auVar50 = vmovlhps_avx(auVar76,auVar50);
          auVar71._0_4_ = auVar81._0_4_ + auVar50._0_4_;
          auVar71._4_4_ = auVar81._4_4_ + auVar50._4_4_;
          auVar71._8_4_ = auVar81._8_4_ + auVar50._8_4_;
          auVar71._12_4_ = auVar81._12_4_ + auVar50._12_4_;
          auVar81 = ZEXT1664(auVar71);
          pfVar37 = pfVar37 + (ulong)(~uVar19 >> 0x1f) * 2 + -1;
          lVar40 = lVar40 + 1;
        } while (lVar40 != 9);
        uVar24 = uVar24 + 0x18;
        uVar21 = uVar21 + (ulong)(-1 < (int)uVar33) * 2 + -1;
        lVar45 = lVar45 + 0x60;
        lVar47 = lVar47 + 0x60;
      } while (uVar24 < uVar33 * 0x18 + 0x198);
      fVar4 = gauss_s2_arr[lVar39];
      auVar17._4_4_ = fVar4;
      auVar17._0_4_ = fVar4;
      auVar17._8_4_ = fVar4;
      auVar17._12_4_ = fVar4;
      auVar52 = vmulps_avx512vl(auVar71,auVar17);
      lVar39 = lVar39 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar44) = auVar52;
      auVar72._0_4_ = auVar52._0_4_ * auVar52._0_4_;
      auVar72._4_4_ = auVar52._4_4_ * auVar52._4_4_;
      auVar72._8_4_ = auVar52._8_4_ * auVar52._8_4_;
      auVar72._12_4_ = auVar52._12_4_ * auVar52._12_4_;
      auVar50 = vmovshdup_avx(auVar72);
      auVar51 = vfmadd231ss_fma(auVar50,auVar52,auVar52);
      auVar50 = vshufpd_avx(auVar52,auVar52,1);
      auVar51 = vfmadd213ss_fma(auVar50,auVar50,auVar51);
      auVar50 = vshufps_avx(auVar52,auVar52,0xff);
      auVar50 = vfmadd213ss_fma(auVar50,auVar50,auVar51);
      fVar64 = fVar64 + auVar50._0_4_;
      lVar44 = lVar44 + 4;
      uVar33 = uVar33 + 5;
      uVar27 = uVar27 + 0x78;
      lVar36 = lVar36 + 0x1e0;
      lVar26 = lVar26 + 0x1e0;
    } while (iVar18 + 4 != (int)lVar39);
    lVar48 = lVar48 + 0x14;
    uVar20 = (ulong)(uVar19 + 5);
  } while ((int)uVar19 < 3);
  if (fVar64 < 0.0) {
    fVar64 = sqrtf(fVar64);
  }
  else {
    auVar50 = vsqrtss_avx(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
    fVar64 = auVar50._0_4_;
  }
  auVar81 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar64)));
  lVar48 = 0;
  do {
    auVar62 = vmulps_avx512f(auVar81,*(undefined1 (*) [64])(ipoint->descriptor + lVar48));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar48) = auVar62;
    lVar48 = lVar48 + 0x10;
  } while (lVar48 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_3_1_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=3, l_count+=3) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=3, l_count+=3) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}